

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

bool __thiscall
glcts::InterfaceMatchingCase::checkCSProg
          (InterfaceMatchingCase *this,Functions *gl,GLuint program,int expectedLink)

{
  undefined1 in_AL;
  undefined7 in_register_00000001;
  int linked;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71(in_register_00000001,in_AL) & 0xffffffff;
  if (program != 0) {
    (*gl->getProgramiv)(program,0x8b82,(GLint *)((long)&uStack_28 + 4));
    if ((expectedLink != 0) && (uStack_28._4_4_ == 0)) {
      logProgramInfoLog(this,gl,program);
    }
  }
  return uStack_28._4_4_ == expectedLink && program != 0;
}

Assistant:

bool checkCSProg(const glw::Functions& gl, GLuint program, int expectedLink = GL_TRUE)
	{
		int linked = GL_FALSE;
		if (program != 0)
		{
			gl.getProgramiv(program, GL_LINK_STATUS, &linked);

			if (expectedLink && !linked)
			{
				logProgramInfoLog(gl, program);
			}
		}

		return (program != 0) && (linked == expectedLink);
	}